

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_file_dir.cxx
# Opt level: O2

char * fl_file_chooser(char *message,char *pat,char *fname,int relative)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Fl_File_Chooser *this;
  char *pcVar4;
  
  if (fc == (Fl_File_Chooser *)0x0) {
    if ((fname == (char *)0x0) || (*fname == '\0')) {
      fname = ".";
    }
    this = (Fl_File_Chooser *)operator_new(0x18b0);
    Fl_File_Chooser::Fl_File_Chooser(this,fname,pat,2,message);
    fc = this;
    Fl_File_Chooser::callback(this,callback,(void *)0x0);
    goto LAB_001e6c2a;
  }
  Fl_File_Chooser::type(fc,2);
  pcVar3 = Fl_File_Chooser::filter(fc);
  if (pat == (char *)0x0 || pcVar3 == (char *)0x0) {
    if (pcVar3 != (char *)0x0) goto LAB_001e6ae6;
LAB_001e6af0:
    if ((pat == (char *)0x0) || (bVar1 = true, *pat == '\0')) {
LAB_001e6aff:
      bVar1 = false;
    }
  }
  else {
    iVar2 = strcmp(pcVar3,pat);
    if (iVar2 == 0) goto LAB_001e6aff;
LAB_001e6ae6:
    bVar1 = true;
    if (*pcVar3 == '\0') goto LAB_001e6af0;
  }
  Fl_File_Chooser::filter(fc,pat);
  Fl_File_Chooser::label(fc,message);
  if (fname == (char *)0x0) {
    if ((!bVar1) || (pcVar3 = Fl_File_Chooser::value(fc,1), pcVar3 == (char *)0x0))
    goto LAB_001e6c2a;
    pcVar3 = Fl_File_Chooser::value(fc,1);
    fl_strlcpy(fl_file_chooser::retname,pcVar3,0x800);
    pcVar3 = strrchr(fl_file_chooser::retname,0x2f);
    if (pcVar3 != (char *)0x0) {
      pcVar4 = fl_file_chooser::retname + 1;
      if (pcVar3 != fl_file_chooser::retname) {
        pcVar4 = pcVar3;
      }
      *pcVar4 = '\0';
    }
    fname = fl_file_chooser::retname;
  }
  else if (*fname == '\0') {
    pcVar3 = Fl_File_Chooser::value(fc,1);
    if (pcVar3 == (char *)0x0) {
      fl_file_chooser::retname[0] = '\0';
    }
    else {
      pcVar3 = Fl_File_Chooser::value(fc,1);
      fl_strlcpy(fl_file_chooser::retname,pcVar3,0x800);
    }
    pcVar3 = fl_filename_name(fl_file_chooser::retname);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
    }
    Fl_File_Chooser::value(fc,"");
    Fl_File_Chooser::directory(fc,fl_file_chooser::retname);
    goto LAB_001e6c2a;
  }
  Fl_File_Chooser::value(fc,fname);
LAB_001e6c2a:
  Fl_File_Chooser::ok_label(fc,current_label);
  popup(fc);
  pcVar3 = Fl_File_Chooser::value(fc,1);
  pcVar4 = Fl_File_Chooser::value(fc,1);
  if ((relative == 0) || (pcVar3 == (char *)0x0)) {
    if (pcVar4 != (char *)0x0) {
      pcVar3 = Fl_File_Chooser::value(fc,1);
      return pcVar3;
    }
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = fl_file_chooser::retname;
    fl_filename_relative(fl_file_chooser::retname,0x800,pcVar4);
  }
  return pcVar3;
}

Assistant:

char *					// O - Filename or NULL
fl_file_chooser(const char *message,	// I - Message in titlebar
                const char *pat,	// I - Filename pattern
		const char *fname,	// I - Initial filename selection
		int        relative) {	// I - 0 for absolute path
  static char	retname[FL_PATH_MAX];		// Returned filename

  if (!fc) {
    if (!fname || !*fname) fname = ".";

    fc = new Fl_File_Chooser(fname, pat, Fl_File_Chooser::CREATE, message);
    fc->callback(callback, 0);
  } else {
    fc->type(Fl_File_Chooser::CREATE);
    // see, if we use the same pattern between calls
    char same_pattern = 0;
    const char *fcf = fc->filter();
    if ( fcf && pat && strcmp(fcf, pat)==0)
      same_pattern = 1;
    else if ( (fcf==0L || *fcf==0) && (pat==0L || *pat==0) )
      same_pattern = 1;
    // now set the pattern to the new pattern (even if they are the same)
    fc->filter(pat);
    fc->label(message);

    if (!fname) { // null pointer reuses same filename if pattern didn't change
      if (!same_pattern && fc->value()) {
	// if pattern is different, remove name but leave old directory:
	strlcpy(retname, fc->value(), sizeof(retname));

	char *p = strrchr(retname, '/');

        if (p) {
	  // If the filename is "/foo", then the directory will be "/", not
	  // ""...
	  if (p == retname)
	    retname[1] = '\0';
	  else
	    *p = '\0';
	}
	// Set the directory...
	fc->value(retname);
      } else {
        // re-use the previously selected name
      }
    } else if (!*fname) { // empty filename reuses directory with empty name
      const char *fcv = fc->value();
      if (fcv) 
        strlcpy(retname, fc->value(), sizeof(retname));
      else 
        *retname = 0;
      const char *n = fl_filename_name(retname);
      if (n) *((char*)n) = 0;
      fc->value("");
      fc->directory(retname);
    } else {
       fc->value(fname);
    }
  }

  fc->ok_label(current_label);
  popup(fc);
  if (fc->value() && relative) {
    fl_filename_relative(retname, sizeof(retname), fc->value());

    return retname;
  } else if (fc->value()) return (char *)fc->value();
  else return 0;
}